

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O2

void G1_makeaffine(G1 *op,ATE_CTX *ctx)

{
  fp_struct_st *op_00;
  fp_struct_st *p;
  fp_struct_st *n0;
  int iVar1;
  fp_struct_st *rop;
  fp_t dummy;
  fp_struct_st fStack_58;
  
  op_00 = op->m_z;
  iVar1 = fp_iszero(op_00);
  if (iVar1 != 0) {
    fp_setzero(op->m_x);
    fp_setone(op->m_y,ctx->rp);
    fp_setzero(op_00);
    return;
  }
  fp_invert(&fStack_58,op_00,ctx);
  p = ctx->p;
  n0 = ctx->n0;
  fp_mul(op->m_x,op->m_x,&fStack_58,p,n0);
  fp_mul(op->m_x,op->m_x,&fStack_58,p,n0);
  rop = op->m_y;
  fp_mul(rop,rop,&fStack_58,p,n0);
  fp_mul(rop,rop,&fStack_58,p,n0);
  fp_mul(rop,rop,&fStack_58,p,n0);
  fp_setone(op_00,ctx->rp);
  return;
}

Assistant:

void G1_makeaffine(G1 *op, const ATE_CTX *ctx)
{
    fp_t dummy;
    if(fp_iszero(op->m_z))
    {
        fp_setzero(op->m_x);
        fp_setone(op->m_y, ctx->rp);
        fp_setzero(op->m_z);
    }
    else
    {
        fp_invert(dummy, op->m_z, ctx);
        fp_mul(op->m_x, op->m_x, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_x, op->m_x, dummy, ctx->p, ctx->n0);

        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);

        fp_setone(op->m_z, ctx->rp);
    }
}